

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  uint uVar6;
  TRef TVar7;
  ulong uVar8;
  ulong uVar9;
  cTValue *pcVar10;
  uint uVar11;
  IRIns *pIVar12;
  byte bVar13;
  IRIns *pIVar14;
  TValue keyv;
  TValue local_38;
  
  pIVar4 = (J->cur).ir;
  pIVar14 = pIVar4 + xref;
  uVar8 = (ulong)(J->fold).ins.field_1.o;
  uVar2 = J->chain[uVar8 + 8];
  while (uVar6 = (uint)uVar2, xref < uVar2) {
    uVar9 = (ulong)uVar2;
    AVar5 = aa_ahref(J,pIVar14,pIVar4 + pIVar4[uVar9].field_0.op1);
    uVar11 = uVar6;
    if (AVar5 == ALIAS_MAY) goto LAB_00125aa5;
    if (AVar5 == ALIAS_MUST) {
      return (uint)*(ushort *)((long)pIVar4 + uVar9 * 8 + 2);
    }
    uVar2 = *(ushort *)((long)pIVar4 + uVar9 * 8 + 6);
  }
  pIVar12 = pIVar14;
  if (((pIVar14->field_1).o & 0xfe) == 0x38) {
    pIVar12 = pIVar4 + (pIVar14->field_0).op1;
  }
  uVar2 = (pIVar12->field_0).op1;
  cVar1 = *(char *)((long)pIVar4 + (ulong)uVar2 * 8 + 5);
  uVar11 = xref;
  if ((cVar1 == 'Q') || ((cVar1 == 'R' && (-1 < (short)(pIVar14->field_0).op2)))) {
    if ((pIVar14->field_1).o == 0x38) {
      for (uVar3 = J->chain[0x3b]; uVar2 < uVar3;
          uVar3 = *(ushort *)((long)pIVar4 + (ulong)uVar3 * 8 + 6)) {
        if ((*(byte *)((long)pIVar4 +
                      (ulong)*(ushort *)((long)pIVar4 + (ulong)uVar3 * 8 + 2) * 8 + 4) & 0x1f) ==
            0xe) goto LAB_00125aa5;
      }
    }
    if (uVar2 < uVar6) {
      do {
        uVar9 = (ulong)uVar6;
        AVar5 = aa_ahref(J,pIVar14,pIVar4 + pIVar4[uVar9].field_0.op1);
        if (AVar5 == ALIAS_MAY) goto LAB_00125aa5;
        if (AVar5 == ALIAS_MUST) {
          return (uint)*(ushort *)((long)pIVar4 + uVar9 * 8 + 2);
        }
        uVar3 = *(ushort *)((long)pIVar4 + uVar9 * 8 + 6);
        uVar6 = (uint)uVar3;
      } while (uVar2 < uVar3);
    }
    bVar13 = (J->fold).ins.field_1.t.irt & 0x1f;
    if (cVar1 == 'Q') {
      if (bVar13 != 0) {
        return 0;
      }
      bVar13 = 0;
    }
    else if (2 < bVar13) {
      if ((bVar13 == 0xe) || (bVar13 == 4)) {
        pIVar14 = pIVar4 + (pIVar14->field_0).op2;
        if ((pIVar14->field_1).o == '\x1e') {
          pIVar14 = pIVar4 + (pIVar14->field_0).op1;
        }
        lj_ir_kvalue(J->L,&local_38,pIVar14);
        pcVar10 = lj_tab_get(J->L,(GCtab *)(J->cur).ir[(ulong)pIVar4[uVar2].field_0.op1 + 1],
                             &local_38);
        if (((J->fold).ins.field_1.t.irt & 0x1f) == 0xe) {
          TVar7 = lj_ir_knum_u64(J,pcVar10->u64);
          return TVar7;
        }
        TVar7 = lj_ir_kgc(J,(GCobj *)(pcVar10->u64 & 0x7fffffffffff),IRT_STR);
        return TVar7;
      }
      goto LAB_00125aa5;
    }
    uVar6 = ((uint)bVar13 << 0x18 | (uint)bVar13) ^ 0x7fff;
  }
  else {
LAB_00125aa5:
    uVar2 = J->chain[uVar8];
    while (uVar6 = (uint)uVar2, uVar11 < uVar6) {
      if (pIVar4[uVar6].field_0.op1 == xref) {
        return uVar6;
      }
      uVar2 = *(ushort *)((long)pIVar4 + (ulong)uVar6 * 8 + 6);
    }
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      if (ir->o == IR_TNEW && !irt_isnil(fins->t))
	return 0;  /* Type instability in loop-carried dependency. */
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lj_assertJ(itype2irt(tv) == irt_type(fins->t),
		   "mismatched type in constant table");
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}